

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O3

QString * __thiscall
QTlsPrivate::X509CertificateOpenSSL::toText
          (QString *__return_storage_ptr__,X509CertificateOpenSSL *this)

{
  X509 *b;
  uint uVar1;
  BIO_METHOD *a;
  BIO *a_00;
  QArrayData *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArray local_4060;
  ulong local_4048;
  undefined8 local_4040;
  char *local_4038;
  char local_4030 [16384];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  b = this->x509;
  if (b != (X509 *)0x0) {
    a = q_BIO_s_mem();
    a_00 = q_BIO_new(a);
    if (a_00 != (BIO *)0x0) {
      q_X509_print(a_00,b);
      memset(local_4030,0xaa,0x4000);
      local_4048 = 0x4000;
      local_4040 = 0;
      local_4038 = local_4030;
      uVar1 = q_BIO_read(a_00,local_4030,0x4000);
      if ((int)uVar1 < 1) {
        local_4060.d.size = 0;
        pQVar2 = (QArrayData *)0x0;
      }
      else {
        QByteArray::QByteArray(&local_4060,local_4038,(ulong)uVar1);
        pQVar2 = &(local_4060.d.d)->super_QArrayData;
      }
      QVar3.m_data = (storage_type *)local_4060.d.size;
      QVar3.m_size = (qsizetype)__return_storage_ptr__;
      QString::fromLatin1(QVar3);
      if (local_4038 != local_4030) {
        QtPrivate::sizedFree(local_4038,local_4048);
      }
      q_BIO_free(a_00);
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,1,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return __return_storage_ptr__;
      }
      goto LAB_0011ce05;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_0011ce05:
  __stack_chk_fail();
}

Assistant:

QString X509CertificateOpenSSL::toText() const
{
    if (!x509)
        return {};

    return x509ToText(x509);
}